

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

void cmCMakePresetsErrors::BUILD_TEST_PRESETS_UNSUPPORTED(Value *param_1,cmJSONState *state)

{
  allocator<char> local_39;
  string local_38;
  cmJSONState *local_18;
  cmJSONState *state_local;
  Value *param_0_local;
  
  local_18 = state;
  state_local = (cmJSONState *)param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "File version must be 2 or higher for build and test preset support",&local_39);
  cmJSONState::AddError(state,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void BUILD_TEST_PRESETS_UNSUPPORTED(const Json::Value*, cmJSONState* state)
{
  state->AddError("File version must be 2 or higher for build and test preset "
                  "support");
}